

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiPVWRFromFile(ndicapi *pol,int port,char *filename)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  char hexdata [128];
  uchar buffer [1024];
  
  pol->ErrorCode = 0;
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    memset(buffer,0,0x400);
    fread(buffer,1,0x400,__stream);
    iVar1 = ferror(__stream);
    fclose(__stream);
    if (iVar1 == 0) {
      uVar2 = 0;
      do {
        if (0x3ff < uVar2) {
          return 0;
        }
        ndiHexEncode(hexdata,buffer + uVar2,0x40);
        ndiCommand(pol,"PVWR:%02X%04X%.128s",port,uVar2 & 0xffffffff,hexdata);
        uVar2 = uVar2 + 0x40;
      } while (pol->ErrorCode == 0);
    }
  }
  return -1;
}

Assistant:

ndicapiExport int ndiPVWRFromFile(ndicapi* pol, int port, char* filename)
{
  unsigned char buffer[1024];
  char hexdata[128];
  FILE* file;
  int addr;

  pol->ErrorCode = 0;

  file = fopen(filename, "rb");
  if (file == NULL)
  {
    return -1;
  }

  memset(buffer, 0, 1024);      // clear buffer to zero
  fread(buffer, 1, 1024, file); // read at most 1k from file
  if (ferror(file))
  {
    fclose(file);
    return -1;
  }
  fclose(file);

  for (addr = 0; addr < 1024; addr += 64)   // write in chunks of 64 bytes
  {
    ndiPVWR(pol, port, addr, ndiHexEncode(hexdata, &buffer[addr], 64));
    if (ndiGetError(pol) != NDI_OKAY)
    {
      return -1;
    }
  }

  return 0;
}